

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scanner.c
# Opt level: O3

_Bool opening_token(Env *env,uint32_t i)

{
  int c;
  State *pSVar1;
  _Bool _Var2;
  uint uVar3;
  TSLexer *pTVar4;
  
  pSVar1 = env->state;
  uVar3 = (pSVar1->lookahead).offset + 1;
  if (uVar3 < (pSVar1->lookahead).size) {
    pTVar4 = (TSLexer *)((pSVar1->lookahead).contents + uVar3);
  }
  else {
    advance_before(env,1);
    pTVar4 = env->lexer;
  }
  c = pTVar4->lookahead;
  _Var2 = true;
  if (c < 0x7b) {
    if ((0x39 < c - 0x22U) || ((0x200000000000041U >> ((ulong)(c - 0x22U) & 0x3f) & 1) == 0)) {
LAB_0010b35a:
      _Var2 = is_id_char(c);
      return _Var2;
    }
  }
  else if ((c != 0x2987) && (c != 0x27e6)) {
    if (c != 0x7b) goto LAB_0010b35a;
    pSVar1 = env->state;
    uVar3 = (pSVar1->lookahead).offset + 2;
    if (uVar3 < (pSVar1->lookahead).size) {
      pTVar4 = (TSLexer *)((pSVar1->lookahead).contents + uVar3);
    }
    else {
      advance_before(env,2);
      pTVar4 = env->lexer;
    }
    _Var2 = pTVar4->lookahead != 0x2d;
  }
  return _Var2;
}

Assistant:

static bool opening_token(Env *env, uint32_t i) {
  int32_t c = peek(env, i);
  switch (c) {
    case 0x27e6: // ⟦
    case 0x2987: // ⦇
    case '(':
    case '[':
    case '"':
      return true;
    case '{':
      return peek(env, i + 1) != '-';
    default:
      // Includes single quote
      return is_id_char(c);
  }
}